

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu383.c
# Opt level: O0

MPP_RET hal_h265d_vdpu383_control(void *hal,MpiCmd cmd_type,void *param)

{
  MppFrameFormat MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  RK_U32 imgheight;
  RK_U32 imgwidth;
  MppFrameFormat fmt;
  MppFrame frame;
  HalH265dCtx *p_hal;
  MPP_RET ret;
  void *param_local;
  MpiCmd cmd_type_local;
  void *hal_local;
  
  if (cmd_type == MPP_DEC_SET_FRAME_INFO) {
    MVar1 = mpp_frame_get_fmt(param);
    RVar2 = mpp_frame_get_width(param);
    RVar3 = mpp_frame_get_height(param);
    if (MVar1 == MPP_FMT_YUV422SP) {
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_LEN_ALIGN,rkv_len_align_422);
    }
    else if ((MVar1 == MPP_FMT_YUV444SP) || (MVar1 == MPP_FMT_YUV444SP_10BIT)) {
      mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_LEN_ALIGN,rkv_len_align_444);
    }
    if ((MVar1 & 0xf00000) == MPP_FMT_YUV420SP) {
      if ((0x780 < RVar2) || (0x440 < RVar3)) {
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,
                           mpp_align_128_odd_plus_64);
      }
    }
    else {
      vdpu383_afbc_align_calc(*(MppBufSlots *)((long)hal + 0x20),param,0x10);
    }
  }
  else if ((cmd_type != MPP_DEC_SET_OUTPUT_FORMAT) && (cmd_type == MPP_DEC_GET_THUMBNAIL_FRAME_INFO)
          ) {
    vdpu383_update_thumbnail_frame_info(param);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265d_vdpu383_control(void *hal, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_OK;
    HalH265dCtx *p_hal = (HalH265dCtx *)hal;

    (void)hal;
    (void)param;
    switch ((MpiCmd)cmd_type) {
    case MPP_DEC_SET_FRAME_INFO: {
        MppFrame frame = (MppFrame)param;
        MppFrameFormat fmt = mpp_frame_get_fmt(frame);
        RK_U32 imgwidth = mpp_frame_get_width((MppFrame)param);
        RK_U32 imgheight = mpp_frame_get_height((MppFrame)param);

        if (fmt == MPP_FMT_YUV422SP) {
            mpp_slots_set_prop(p_hal->slots, SLOTS_LEN_ALIGN, rkv_len_align_422);
        } else if (fmt == MPP_FMT_YUV444SP || fmt == MPP_FMT_YUV444SP_10BIT) {
            mpp_slots_set_prop(p_hal->slots, SLOTS_LEN_ALIGN, rkv_len_align_444);
        }
        if (MPP_FRAME_FMT_IS_FBC(fmt)) {
            vdpu383_afbc_align_calc(p_hal->slots, frame, 16);
        } else if (imgwidth > 1920 || imgheight > 1088) {
            mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, mpp_align_128_odd_plus_64);
        }
        break;
    }
    case MPP_DEC_GET_THUMBNAIL_FRAME_INFO: {
        vdpu383_update_thumbnail_frame_info((MppFrame)param);
    } break;
    case MPP_DEC_SET_OUTPUT_FORMAT: {
    } break;
    default: {
    } break;
    }
    return  ret;
}